

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

bool gl4cts::Utils::isGLVersionAtLeast(Functions *gl,GLint required_major,GLint required_minor)

{
  bool bVar1;
  GLenum err;
  GLint minor;
  GLint major;
  GLint local_30;
  GLint local_2c;
  
  local_2c = 0;
  local_30 = 0;
  (*gl->getIntegerv)(0x821b,&local_2c);
  (*gl->getIntegerv)(0x821c,&local_30);
  err = (*gl->getError)();
  glu::checkError(err,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x5c9);
  bVar1 = true;
  if (local_2c <= required_major) {
    if (local_2c == required_major) {
      bVar1 = required_minor <= local_30;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool Utils::isGLVersionAtLeast(const glw::Functions& gl, glw::GLint required_major, glw::GLint required_minor)
{
	glw::GLint major = 0;
	glw::GLint minor = 0;

	gl.getIntegerv(GL_MAJOR_VERSION, &major);
	gl.getIntegerv(GL_MINOR_VERSION, &minor);

	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	if (major > required_major)
	{
		/* Major is higher than required one */
		return true;
	}
	else if (major == required_major)
	{
		if (minor >= required_minor)
		{
			/* Major is equal to required one */
			/* Minor is higher than or equal to required one */
			return true;
		}
		else
		{
			/* Major is equal to required one */
			/* Minor is lower than required one */
			return false;
		}
	}
	else
	{
		/* Major is lower than required one */
		return false;
	}
}